

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::OpenPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  if (4 < (popup_flags & 0x1fU)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1172,"IsMouseReleased","ImGui ASSERT FAILED: %s",
                "button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown)");
  }
  if (((pIVar1->IO).MouseReleased[popup_flags & 0x1fU] == true) && (bVar2 = IsItemHovered(8), bVar2)
     ) {
    if (str_id == (char *)0x0) {
      id = (this->DC).LastItemId;
    }
    else {
      id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    }
    if (id == 0) {
      id = 0;
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1eb8,"OpenPopupContextItem","ImGui ASSERT FAILED: %s","id != 0");
    }
    OpenPopupEx(id,popup_flags);
    return true;
  }
  return false;
}

Assistant:

bool ImGui::OpenPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
        return true;
    }
    return false;
}